

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# targets.c
# Opt level: O2

void new_priptr(ObjectUnit *ou,char *sec,char *label,int pri,char *xref,lword addend)

{
  node *n;
  
  n = (node *)alloc(0x38);
  n[1].next = (node *)sec;
  n[1].pred = (node *)label;
  *(int *)&n[2].next = pri;
  n[2].pred = (node *)xref;
  n[3].next = (node *)0x0;
  addtail(&ou->pripointers,n);
  return;
}

Assistant:

static void new_priptr(struct ObjectUnit *ou,const char *sec,const char *label,
                       int pri,const char *xref,lword addend)
/* Inserts a new longword into the object's PriPointers list. */
{
  struct PriPointer *newpp = alloc(sizeof(struct PriPointer));

  newpp->secname = sec;
  newpp->listname = label;
  newpp->priority = pri;
  newpp->xrefname = xref;
  newpp->addend = addend;
  addtail(&ou->pripointers,&newpp->n);
}